

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O0

Vec_Ptr_t * Aig_ManRegPartitionSmart(Aig_Man_t *pAig,int nPartSize)

{
  char *__s;
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Aig_ManPre_t *p_00;
  Vec_Int_t *Entry;
  uint local_34;
  int k;
  int i;
  int iNext;
  int iSeed;
  Vec_Ptr_t *vResult;
  Aig_ManPre_t *p;
  int nPartSize_local;
  Aig_Man_t *pAig_local;
  
  p_00 = Aig_ManRegManStart(pAig,nPartSize);
  local_34 = 0;
  do {
    iVar2 = Aig_ManRegFindSeed(p_00);
    if (iVar2 < 0) {
      pVVar1 = p_00->vParts;
      p_00->vParts = (Vec_Ptr_t *)0x0;
      Aig_ManRegManStop(p_00);
      return pVVar1;
    }
    Vec_IntClear(p_00->vRegs);
    Vec_IntClear(p_00->vUniques);
    Vec_IntClear(p_00->vFreeVars);
    Vec_FltClear(p_00->vPartCost);
    __s = p_00->pfPartVars;
    iVar3 = Aig_ManRegNum(p_00->pAig);
    memset(__s,0,(long)iVar3);
    Aig_ManRegPartitionAdd(p_00,iVar2);
    do {
      iVar2 = Vec_IntSize(p_00->vRegs);
      if ((p_00->nRegsMax <= iVar2) || (iVar2 = Aig_ManRegFindBestVar(p_00), iVar2 == -1)) break;
      Aig_ManRegPartitionAdd(p_00,iVar2);
      iVar2 = Vec_IntSize(p_00->vFreeVars);
    } while (iVar2 != 0);
    pVVar1 = p_00->vParts;
    Entry = Vec_IntDup(p_00->vRegs);
    Vec_PtrPush(pVVar1,Entry);
    uVar4 = Vec_IntSize(p_00->vFreeVars);
    uVar5 = Vec_IntSize(p_00->vRegs);
    iVar2 = Vec_IntSize(p_00->vFreeVars);
    iVar3 = Vec_IntSize(p_00->vRegs);
    uVar6 = Vec_IntSize(p_00->vUniques);
    printf("Part %3d  SUMMARY:  Free = %4d. Total = %4d. Ratio = %6.2f. Unique = %4d.\n",
           ((double)iVar2 * 1.0) / (double)iVar3,(ulong)local_34,(ulong)uVar4,(ulong)uVar5,
           (ulong)uVar6);
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Aig_ManRegPartitionSmart( Aig_Man_t * pAig, int nPartSize )
{
    extern void Ioa_WriteAiger( Aig_Man_t * pMan, char * pFileName, int fWriteSymbols, int fCompact );

    Aig_ManPre_t * p;
    Vec_Ptr_t * vResult;
    int iSeed, iNext, i, k;
    // create the manager
    p = Aig_ManRegManStart( pAig, nPartSize );
    // add partitions as long as registers remain
    for ( i = 0; (iSeed = Aig_ManRegFindSeed(p)) >= 0; i++ )
    {
//printf( "Seed variable = %d.\n", iSeed );
        // clean the current partition information
        Vec_IntClear( p->vRegs );
        Vec_IntClear( p->vUniques );
        Vec_IntClear( p->vFreeVars );
        Vec_FltClear( p->vPartCost );
        memset( p->pfPartVars, 0, sizeof(char) * Aig_ManRegNum(p->pAig) );
        // add the register and its partition support
        Aig_ManRegPartitionAdd( p, iSeed );
        // select the best var to add
        for ( k = 0; Vec_IntSize(p->vRegs) < p->nRegsMax; k++ )
        {
            // get the next best variable
            iNext = Aig_ManRegFindBestVar( p );
            if ( iNext == -1 )
                break;
            // add the register to the support of the partition
            Aig_ManRegPartitionAdd( p, iNext );
            // report the result
//printf( "Part %3d  Reg %3d : Free = %4d. Total = %4d. Ratio = %6.2f. Unique = %4d.\n", i, k, 
//                Vec_IntSize(p->vFreeVars), Vec_IntSize(p->vRegs), 
//                1.0*Vec_IntSize(p->vFreeVars)/Vec_IntSize(p->vRegs), Vec_IntSize(p->vUniques) );
            // quit if there are not free variables
            if ( Vec_IntSize(p->vFreeVars) == 0 )
                break;
        }
        // add this partition to the set
        Vec_PtrPush( p->vParts, Vec_IntDup(p->vRegs) );        
printf( "Part %3d  SUMMARY:  Free = %4d. Total = %4d. Ratio = %6.2f. Unique = %4d.\n", i,
                Vec_IntSize(p->vFreeVars), Vec_IntSize(p->vRegs), 
                1.0*Vec_IntSize(p->vFreeVars)/Vec_IntSize(p->vRegs), Vec_IntSize(p->vUniques) );
//printf( "\n" ); 
    }
    vResult = p->vParts; p->vParts = NULL;
    Aig_ManRegManStop( p );
    return vResult;
}